

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O1

void __thiscall
embree::SceneGraph::Transformations::add(Transformations *this,Transformations *other)

{
  Vector *pVVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  size_t sVar4;
  ulong uVar5;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined8 uVar23;
  ulong uVar24;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  
  if ((other->spaces).size_active != 0) {
    uVar29 = 0;
    do {
      sVar4 = (this->spaces).size_active;
      uVar5 = (this->spaces).size_alloced;
      uVar27 = sVar4 + 1;
      uVar28 = uVar5;
      if ((uVar5 < uVar27) && (uVar28 = uVar27, uVar24 = uVar5, uVar5 != 0)) {
        for (; uVar28 = uVar24, uVar24 < uVar27; uVar24 = uVar24 * 2 + (ulong)(uVar24 * 2 == 0)) {
        }
      }
      pAVar25 = (other->spaces).items;
      pAVar6 = pAVar25 + uVar29;
      fVar7 = (pAVar6->l).vx.field_0.m128[0];
      fVar8 = (pAVar6->l).vx.field_0.m128[1];
      fVar9 = (pAVar6->l).vx.field_0.m128[2];
      fVar10 = (pAVar6->l).vx.field_0.m128[3];
      pVVar1 = &pAVar25[uVar29].l.vy;
      fVar11 = (pVVar1->field_0).m128[0];
      fVar12 = (pVVar1->field_0).m128[1];
      fVar13 = (pVVar1->field_0).m128[2];
      fVar14 = (pVVar1->field_0).m128[3];
      pVVar1 = &pAVar25[uVar29].l.vz;
      fVar15 = (pVVar1->field_0).m128[0];
      fVar16 = (pVVar1->field_0).m128[1];
      fVar17 = (pVVar1->field_0).m128[2];
      fVar18 = (pVVar1->field_0).m128[3];
      pVVar1 = &pAVar25[uVar29].p;
      fVar19 = (pVVar1->field_0).m128[0];
      fVar20 = (pVVar1->field_0).m128[1];
      fVar21 = (pVVar1->field_0).m128[2];
      fVar22 = (pVVar1->field_0).m128[3];
      if (uVar5 != uVar28) {
        pAVar6 = (this->spaces).items;
        pAVar25 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                  alignedMalloc(uVar28 << 6,0x10);
        (this->spaces).items = pAVar25;
        if ((this->spaces).size_active != 0) {
          lVar26 = 0x30;
          uVar27 = 0;
          do {
            pAVar25 = (this->spaces).items;
            puVar2 = (undefined8 *)((long)pAVar6 + lVar26 + -0x30);
            uVar23 = puVar2[1];
            puVar3 = (undefined8 *)((long)pAVar25 + lVar26 + -0x30);
            *puVar3 = *puVar2;
            puVar3[1] = uVar23;
            puVar2 = (undefined8 *)((long)pAVar6 + lVar26 + -0x20);
            uVar23 = puVar2[1];
            puVar3 = (undefined8 *)((long)pAVar25 + lVar26 + -0x20);
            *puVar3 = *puVar2;
            puVar3[1] = uVar23;
            puVar2 = (undefined8 *)((long)pAVar6 + lVar26 + -0x10);
            uVar23 = puVar2[1];
            puVar3 = (undefined8 *)((long)pAVar25 + lVar26 + -0x10);
            *puVar3 = *puVar2;
            puVar3[1] = uVar23;
            puVar2 = (undefined8 *)((long)&(pAVar6->l).vx.field_0 + lVar26);
            uVar23 = puVar2[1];
            puVar3 = (undefined8 *)((long)&(pAVar25->l).vx.field_0 + lVar26);
            *puVar3 = *puVar2;
            puVar3[1] = uVar23;
            uVar27 = uVar27 + 1;
            lVar26 = lVar26 + 0x40;
          } while (uVar27 < (this->spaces).size_active);
        }
        alignedFree(pAVar6);
        (this->spaces).size_active = sVar4;
        (this->spaces).size_alloced = uVar28;
      }
      sVar4 = (this->spaces).size_active;
      pAVar25 = (this->spaces).items;
      (this->spaces).size_active = sVar4 + 1;
      pAVar6 = pAVar25 + sVar4;
      (pAVar6->l).vx.field_0.m128[0] = fVar7;
      (pAVar6->l).vx.field_0.m128[1] = fVar8;
      (pAVar6->l).vx.field_0.m128[2] = fVar9;
      (pAVar6->l).vx.field_0.m128[3] = fVar10;
      pVVar1 = &pAVar25[sVar4].l.vy;
      (pVVar1->field_0).m128[0] = fVar11;
      (pVVar1->field_0).m128[1] = fVar12;
      (pVVar1->field_0).m128[2] = fVar13;
      (pVVar1->field_0).m128[3] = fVar14;
      pVVar1 = &pAVar25[sVar4].l.vz;
      (pVVar1->field_0).m128[0] = fVar15;
      (pVVar1->field_0).m128[1] = fVar16;
      (pVVar1->field_0).m128[2] = fVar17;
      (pVVar1->field_0).m128[3] = fVar18;
      pVVar1 = &pAVar25[sVar4].p;
      (pVVar1->field_0).m128[0] = fVar19;
      (pVVar1->field_0).m128[1] = fVar20;
      (pVVar1->field_0).m128[2] = fVar21;
      (pVVar1->field_0).m128[3] = fVar22;
      uVar29 = uVar29 + 1;
    } while (uVar29 < (other->spaces).size_active);
  }
  return;
}

Assistant:

void add (const Transformations& other) {
        for (size_t i=0; i<other.size(); i++) spaces.push_back(other[i]);
      }